

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall glcts::LayoutBindingBaseCase::unbind(LayoutBindingBaseCase *this,int binding)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Functions *pFVar2;
  GLenum local_18;
  GLint texTarget;
  int binding_local;
  LayoutBindingBaseCase *this_local;
  
  local_18 = 0;
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  iVar1 = *(int *)(CONCAT44(extraout_var,iVar1) + 0xc);
  if (iVar1 == 2) {
    local_18 = 0xde1;
  }
  else if (iVar1 == 3) {
    local_18 = 0x806f;
  }
  else if (iVar1 == 5) {
    local_18 = 0x8c1a;
  }
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 8);
  if (iVar1 == 1) {
    pFVar2 = gl(this);
    (*pFVar2->activeTexture)(binding + 0x84c0);
    pFVar2 = gl(this);
    (*pFVar2->bindTexture)(local_18,0);
  }
  else if (iVar1 == 2) {
    pFVar2 = gl(this);
    (*pFVar2->bindImageTexture)(binding,0,0,'\0',0,35000,0x822e);
  }
  return;
}

Assistant:

virtual void unbind(int binding)
	{
		glw::GLint texTarget = 0;

		switch (getTestParameters().texture_type)
		{
		case TwoD:
			texTarget = GL_TEXTURE_2D;
			break;
		case TwoDArray:
			texTarget = GL_TEXTURE_2D_ARRAY;
			break;
		case ThreeD:
			texTarget = GL_TEXTURE_3D;
			break;
		default:
			DE_ASSERT(0);
			break;
		}

		switch (getTestParameters().surface_type)
		{
		case Texture:
			gl().activeTexture(GL_TEXTURE0 + binding);
			gl().bindTexture(texTarget, 0);
			break;
		case Image:
			gl().bindImageTexture(binding, 0, 0, GL_FALSE, 0, GL_READ_ONLY, GL_R32F);
			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}